

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

int run_test_fork_fs_events_file_parent_child(void)

{
  int iVar1;
  __pid_t child_pid;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  char *unaff_R14;
  uv_fs_event_t fs_event;
  uv_timer_t timer;
  undefined1 auStack_8c0 [128];
  code *pcStack_840;
  uv_loop_t uStack_838;
  code *pcStack_4e8;
  undefined8 uStack_4e0;
  undefined1 auStack_4d0 [16];
  undefined1 auStack_4c0 [440];
  ulong uStack_308;
  code *pcStack_300;
  code *pcStack_2f8;
  char acStack_2f0 [440];
  ulong uStack_138;
  undefined1 auStack_128 [136];
  undefined1 local_a0 [152];
  
  uVar4 = uv_default_loop();
  pcVar8 = "watch_file";
  remove("watch_file");
  create_file(pcVar8);
  iVar1 = uv_fs_event_init(uVar4,auStack_128);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start(auStack_128,fs_event_cb_file_current_dir,"watch_file",0);
    if (iVar1 != 0) goto LAB_0014f9db;
    iVar1 = uv_timer_init(uVar4,local_a0);
    if (iVar1 != 0) goto LAB_0014f9e0;
    child_pid = fork();
    if (child_pid != 0) {
      if (child_pid != -1) {
        assert_wait_child(child_pid);
LAB_0014f997:
        uVar4 = uv_default_loop();
        uv_walk(uVar4,close_walk_cb,0);
        uv_run(uVar4,0);
        uv_default_loop();
        iVar1 = uv_loop_close();
        if (iVar1 == 0) {
          return 0;
        }
        goto LAB_0014f9e5;
      }
      goto LAB_0014f9ea;
    }
    puts("Running child");
    iVar1 = uv_loop_fork();
    if (iVar1 != 0) goto LAB_0014f9ef;
    iVar1 = uv_timer_start(local_a0,timer_cb_touch,100,0);
    if (iVar1 != 0) goto LAB_0014f9f4;
    if (timer_cb_touch_called != 0) goto LAB_0014f9f9;
    if (fs_event_cb_called == '\x01') goto LAB_0014f9fe;
    puts("Running loop in child ");
    uv_run(uVar4,0);
    if (timer_cb_touch_called != 1) goto LAB_0014fa03;
    if (fs_event_cb_called != '\0') {
      remove("watch_file");
      fs_event_cb_called = '\0';
      timer_cb_touch_called = 0;
      uv_run(uVar4,0);
      goto LAB_0014f997;
    }
  }
  else {
    run_test_fork_fs_events_file_parent_child_cold_1();
LAB_0014f9db:
    run_test_fork_fs_events_file_parent_child_cold_2();
LAB_0014f9e0:
    run_test_fork_fs_events_file_parent_child_cold_3();
LAB_0014f9e5:
    run_test_fork_fs_events_file_parent_child_cold_11();
LAB_0014f9ea:
    run_test_fork_fs_events_file_parent_child_cold_10();
LAB_0014f9ef:
    run_test_fork_fs_events_file_parent_child_cold_4();
LAB_0014f9f4:
    run_test_fork_fs_events_file_parent_child_cold_5();
LAB_0014f9f9:
    run_test_fork_fs_events_file_parent_child_cold_6();
LAB_0014f9fe:
    run_test_fork_fs_events_file_parent_child_cold_9();
LAB_0014fa03:
    run_test_fork_fs_events_file_parent_child_cold_7();
  }
  run_test_fork_fs_events_file_parent_child_cold_8();
  pcVar8 = acStack_2f0;
  pcVar7 = acStack_2f0;
  uVar9 = 0;
  iVar1 = 0x41;
  pcStack_2f8 = (code *)0x14fa36;
  uStack_138 = uVar4;
  uVar2 = uv_fs_open(0,acStack_2f0,"watch_file",0x41,0x180,0);
  if ((int)uVar2 < 0) {
    pcStack_2f8 = (code *)0x14fa71;
    create_file_cold_1();
  }
  else {
    uVar4 = (ulong)uVar2;
    pcStack_2f8 = (code *)0x14fa47;
    uv_fs_req_cleanup();
    uVar9 = 0;
    iVar1 = 0;
    pcStack_2f8 = (code *)0x14fa55;
    iVar3 = uv_fs_close(0,acStack_2f0,uVar4);
    pcVar8 = pcVar7;
    unaff_R14 = acStack_2f0;
    if (iVar3 == 0) {
      pcStack_2f8 = (code *)0x14fa61;
      iVar1 = uv_fs_req_cleanup(acStack_2f0);
      return iVar1;
    }
  }
  pcStack_2f8 = fs_event_cb_file_current_dir;
  create_file_cold_2();
  pcStack_2f8 = (code *)uVar4;
  if (fs_event_cb_called == '\x01') {
    pcStack_300 = (code *)0x14fab4;
    fs_event_cb_file_current_dir_cold_3();
LAB_0014fab4:
    pcStack_300 = (code *)0x14fab9;
    fs_event_cb_file_current_dir_cold_1();
  }
  else {
    fs_event_cb_called = '\x01';
    if (iVar1 != 0) goto LAB_0014fab4;
    pcStack_300 = (code *)0x14faa0;
    iVar1 = strcmp(pcVar8,"watch_file");
    uVar4 = uVar9;
    if (iVar1 == 0) {
      iVar1 = uv_close(uVar9,0);
      return iVar1;
    }
  }
  pcStack_300 = timer_cb_touch;
  fs_event_cb_file_current_dir_cold_2();
  pcStack_4e8 = (code *)0x14facf;
  uStack_308 = uVar4;
  pcStack_300 = (code *)unaff_R14;
  uv_close();
  pcStack_4e8 = (code *)0x14faed;
  uVar2 = uv_fs_open(0,auStack_4c0,"watch_file",2,0,0);
  if ((int)uVar2 < 0) {
    pcStack_4e8 = (code *)0x14fb85;
    timer_cb_touch_cold_1();
LAB_0014fb85:
    pcStack_4e8 = (code *)0x14fb8a;
    timer_cb_touch_cold_2();
  }
  else {
    uVar4 = (ulong)uVar2;
    pcStack_4e8 = (code *)0x14fb04;
    uv_fs_req_cleanup(auStack_4c0);
    pcStack_4e8 = (code *)0x14fb15;
    auStack_4d0 = uv_buf_init("foo",4);
    uStack_4e0 = 0;
    pcStack_4e8 = (code *)0x14fb42;
    iVar1 = uv_fs_write(0,auStack_4c0,uVar4,auStack_4d0,1,0xffffffffffffffff);
    if (iVar1 < 0) goto LAB_0014fb85;
    pcStack_4e8 = (code *)0x14fb53;
    uv_fs_req_cleanup(auStack_4c0);
    pcStack_4e8 = (code *)0x14fb61;
    iVar1 = uv_fs_close(0,auStack_4c0,uVar2,0);
    if (iVar1 == 0) {
      pcStack_4e8 = (code *)0x14fb6f;
      iVar1 = uv_fs_req_cleanup(auStack_4c0);
      timer_cb_touch_called = timer_cb_touch_called + 1;
      return iVar1;
    }
  }
  pcStack_4e8 = run_test_fork_threadpool_queue_work_simple;
  timer_cb_touch_cold_3();
  puVar6 = &uStack_838;
  pcStack_840 = (code *)0x14fb9c;
  pcStack_4e8 = (code *)uVar4;
  puVar5 = (uv_loop_t *)uv_default_loop();
  pcStack_840 = (code *)0x14fba4;
  assert_run_work(puVar5);
  pcStack_840 = (code *)0x14fba9;
  uVar2 = fork();
  if (uVar2 == 0) {
    pcStack_840 = (code *)0x14fbd3;
    uVar2 = getpid();
    pcStack_840 = (code *)0x14fbe3;
    printf("Running child in %d\n",(ulong)uVar2);
    pcStack_840 = (code *)0x14fbee;
    uv_loop_init(&uStack_838);
    pcStack_840 = (code *)0x14fbfa;
    puts("Child first watch");
    pcStack_840 = (code *)0x14fc02;
    assert_run_work(&uStack_838);
    pcStack_840 = (code *)0x14fc0a;
    uv_loop_close(&uStack_838);
    pcStack_840 = (code *)0x14fc16;
    puts("Child second watch default loop");
    pcStack_840 = (code *)0x14fc1b;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_840 = (code *)0x14fc23;
    iVar1 = uv_loop_fork(puVar5);
    if (iVar1 == 0) {
      pcStack_840 = (code *)0x14fc2c;
      puVar5 = (uv_loop_t *)uv_default_loop();
      pcStack_840 = (code *)0x14fc34;
      assert_run_work(puVar5);
      pcStack_840 = (code *)0x14fc40;
      puts("Exiting child ");
      goto LAB_0014fc40;
    }
  }
  else {
    puVar6 = (uv_loop_t *)(ulong)uVar2;
    if (uVar2 != 0xffffffff) {
      pcStack_840 = (code *)0x14fbbd;
      puVar5 = (uv_loop_t *)uv_default_loop();
      pcStack_840 = (code *)0x14fbc5;
      assert_run_work(puVar5);
      pcStack_840 = (code *)0x14fbcc;
      assert_wait_child(uVar2);
LAB_0014fc40:
      pcStack_840 = (code *)0x14fc45;
      puVar6 = (uv_loop_t *)uv_default_loop();
      pcStack_840 = (code *)0x14fc59;
      uv_walk(puVar6,close_walk_cb,0);
      pcStack_840 = (code *)0x14fc63;
      uv_run(puVar6,0);
      pcStack_840 = (code *)0x14fc68;
      puVar5 = (uv_loop_t *)uv_default_loop();
      pcStack_840 = (code *)0x14fc70;
      iVar1 = uv_loop_close(puVar5);
      if (iVar1 == 0) {
        return 0;
      }
      pcStack_840 = (code *)0x14fc84;
      run_test_fork_threadpool_queue_work_simple_cold_3();
    }
    pcStack_840 = (code *)0x14fc89;
    run_test_fork_threadpool_queue_work_simple_cold_2();
  }
  pcStack_840 = assert_run_work;
  run_test_fork_threadpool_queue_work_simple_cold_1();
  pcStack_840 = (code *)puVar6;
  if (work_cb_count == 0) {
    if (after_work_cb_count != 0) goto LAB_0014fd32;
    uVar2 = getpid();
    printf("Queue in %d\n",(ulong)uVar2);
    iVar1 = uv_queue_work(puVar5,auStack_8c0,work_cb,after_work_cb);
    if (iVar1 != 0) goto LAB_0014fd37;
    uVar2 = getpid();
    printf("Running in %d\n",(ulong)uVar2);
    uv_run(puVar5,0);
    if (work_cb_count == 1) {
      if (after_work_cb_count == 1) {
        work_cb_count = 0;
        after_work_cb_count = 0;
        return 0;
      }
      goto LAB_0014fd41;
    }
  }
  else {
    assert_run_work_cold_1();
LAB_0014fd32:
    assert_run_work_cold_2();
LAB_0014fd37:
    assert_run_work_cold_3();
  }
  assert_run_work_cold_4();
LAB_0014fd41:
  assert_run_work_cold_5();
  timer_cb_called = timer_cb_called + 1;
  iVar1 = uv_close();
  return iVar1;
}

Assistant:

TEST_IMPL(fork_fs_events_file_parent_child) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
#if defined(__sun) || defined(_AIX) || defined(__MVS__)
  /* It's not possible to implement this without additional
   * bookkeeping on SunOS. For AIX it is possible, but has to be
   * written. See https://github.com/libuv/libuv/pull/846#issuecomment-287170420
   * TODO: On z/OS, we need to open another message queue and subscribe to the
   * same events as the parent.
   */
  return 0;
#else
  /* Establishing a started fs events watcher in the parent should
     still work in the child. */
  uv_timer_t timer;
  uv_fs_event_t fs_event;
  int r;
  pid_t child_pid;
  uv_loop_t* loop;

  loop = uv_default_loop();

  /* Setup */
  remove("watch_file");
  create_file("watch_file");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file_current_dir,
                        "watch_file",
                        0);
  ASSERT(r == 0);

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  child_pid = fork();
  ASSERT(child_pid != -1);
  if (child_pid != 0) {
    /* parent */
    assert_wait_child(child_pid);
  } else {
    /* child */
    printf("Running child\n");
    ASSERT(0 == uv_loop_fork(loop));

    r = uv_timer_start(&timer, timer_cb_touch, 100, 0);
    ASSERT(r == 0);

    ASSERT(timer_cb_touch_called == 0);
    ASSERT(fs_event_cb_called == 0);
    printf("Running loop in child \n");
    uv_run(loop, UV_RUN_DEFAULT);

    ASSERT(timer_cb_touch_called == 1);
    ASSERT(fs_event_cb_called == 1);

    /* Cleanup */
    remove("watch_file");
    fs_event_cb_called = 0;
    timer_cb_touch_called = 0;
    uv_run(loop, UV_RUN_DEFAULT); /* Flush pending closes. */
  }


  MAKE_VALGRIND_HAPPY();
  return 0;
#endif
}